

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::visitElementSegment(PrintSExpression *this,ElementSegment *curr)

{
  ElementSegment *pEVar1;
  Expression *curr_00;
  Index IVar2;
  RefFunc *pRVar3;
  ostream *poVar4;
  iterator __begin2;
  ElementSegment *pEVar5;
  string_view str;
  undefined1 local_138 [176];
  _Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  local_88 [2];
  undefined1 local_58 [8];
  anon_class_24_3_2843ac0c printElemType;
  ElementSegment *curr_local;
  bool usesExpressions;
  
  printElemType.curr = (ElementSegment **)curr;
  curr_local._7_1_ = TableUtils::usesExpressions(curr,this->currModule);
  local_58 = (undefined1  [8])((long)&curr_local + 7);
  printElemType.usesExpressions = (bool *)this;
  printElemType.this = (PrintSExpression *)&printElemType.curr;
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  str._M_str = "elem ";
  str._M_len = 5;
  printMedium(this->o,str);
  Name::print((Name *)printElemType.curr,this->o);
  if (printElemType.curr[4] != (ElementSegment *)0x0) {
    if ((curr_local._7_1_ != '\0') ||
       (8 < (ulong)((long)(this->currModule->tables).
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->currModule->tables).
                         super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start))) {
      std::operator<<(this->o," (table ");
      Name::print((Name *)(printElemType.curr + 3),this->o);
      std::operator<<(this->o,")");
    }
    std::operator<<(this->o,' ');
    memset(local_138,0,0xdc);
    IVar2 = Measurer::measure((Expression *)printElemType.curr[5]);
    std::
    _Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
    ::~_Vector_base(local_88);
    if (IVar2 < 2) {
      visit(this,(Expression *)printElemType.curr[5]);
    }
    else {
      std::operator<<(this->o,"(offset ");
      visit(this,(Expression *)printElemType.curr[5]);
      std::operator<<(this->o,')');
    }
    if ((curr_local._7_1_ == '\0') &&
       ((ulong)((long)(this->currModule->tables).
                      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->currModule->tables).
                     super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9)) goto LAB_00b1b650;
  }
  std::operator<<(this->o,' ');
  visitElementSegment::anon_class_24_3_2843ac0c::operator()((anon_class_24_3_2843ac0c *)local_58);
LAB_00b1b650:
  pEVar5 = printElemType.curr[7];
  pEVar1 = printElemType.curr[8];
  if (curr_local._7_1_ == '\0') {
    for (; pEVar5 != pEVar1;
        pEVar5 = (ElementSegment *)&(pEVar5->super_Named).name.super_IString.str._M_str) {
      pRVar3 = Expression::cast<wasm::RefFunc>
                         ((Expression *)(pEVar5->super_Named).name.super_IString.str._M_len);
      std::operator<<(this->o,' ');
      Name::print(&pRVar3->func,this->o);
    }
  }
  else {
    for (; pEVar5 != pEVar1;
        pEVar5 = (ElementSegment *)&(pEVar5->super_Named).name.super_IString.str._M_str) {
      curr_00 = (Expression *)(pEVar5->super_Named).name.super_IString.str._M_len;
      std::operator<<(this->o," (item ");
      visit(this,curr_00);
      std::operator<<(this->o,')');
    }
  }
  poVar4 = std::operator<<(this->o,')');
  std::operator<<(poVar4,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitElementSegment(ElementSegment* curr) {
  bool usesExpressions = TableUtils::usesExpressions(curr, currModule);
  auto printElemType = [&]() {
    if (!usesExpressions) {
      o << "func";
    } else {
      printType(curr->type);
    }
  };

  doIndent(o, indent);
  o << '(';
  printMedium(o, "elem ");
  curr->name.print(o);

  if (curr->table.is()) {
    if (usesExpressions || currModule->tables.size() > 1) {
      // tableuse
      o << " (table ";
      curr->table.print(o);
      o << ")";
    }

    o << ' ';
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ')';
    }

    if (usesExpressions || currModule->tables.size() > 1) {
      o << ' ';
      printElemType();
    }
  } else {
    o << ' ';
    printElemType();
  }

  if (!usesExpressions) {
    for (auto* entry : curr->data) {
      auto* refFunc = entry->cast<RefFunc>();
      o << ' ';
      refFunc->func.print(o);
    }
  } else {
    for (auto* entry : curr->data) {
      o << " (item ";
      visit(entry);
      o << ')';
    }
  }
  o << ')' << maybeNewLine;
}